

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O2

Bool ParseDocType(TidyDocImpl *doc,TidyOptionImpl *option)

{
  tchar tVar1;
  Bool BVar2;
  undefined8 in_RAX;
  ulong val;
  uint value;
  
  value = (uint)((ulong)in_RAX >> 0x20);
  if ((doc->config).c == 0xffffffff) {
    SetOptionValue(doc,option->id,(ctmbstr)0x0);
  }
  else {
    tVar1 = SkipWhite(&doc->config);
    if ((tVar1 < 0x2e) && ((0x288400000000U >> ((ulong)tVar1 & 0x3f) & 1) != 0)) {
      ParseString(doc,option);
      val = 5;
    }
    else {
      BVar2 = GetParsePickListValue(doc,option,&value);
      if (BVar2 == no) {
        prvTidyReportBadArgument(doc,option->name);
        return no;
      }
      val = (ulong)value;
    }
    prvTidySetOptionInt(doc,TidyDoctypeMode,val);
  }
  return yes;
}

Assistant:

Bool ParseDocType( TidyDocImpl* doc, const TidyOptionImpl* option )
{
    Bool status = yes;
    uint value;
    TidyConfigImpl* cfg = &doc->config;
    tchar c;

    /* Given an empty string, so signal success. */
    if ( cfg->c == EndOfStream )
    {
        SetOptionValue( doc, option->id, NULL );
        return yes;
    }

    c = SkipWhite( cfg );


    /* "-//ACME//DTD HTML 3.14159//EN" or similar */

    if ( c == '"' || c == '\''|| c == '-' || c == '+' )
    {
        status = ParseString(doc, option);
        if (status)
        {
            TY_(SetOptionInt)( doc, TidyDoctypeMode, TidyDoctypeUser );
        }
        return status;
    }
    
    if ( (status = GetParsePickListValue( doc, option, &value ) ) )
    {
        TY_(SetOptionInt)( doc, TidyDoctypeMode, value );
    }
    else
    {
        TY_(ReportBadArgument)( doc, option->name );
    }
    
    return status;
}